

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

void __thiscall HyperLogLog::ParseHyperLogLog(HyperLogLog *this,char *line,size_t *index)

{
  size_t sVar1;
  uint64_t uVar2;
  byte *pbVar3;
  ulong uVar4;
  int i;
  long lVar5;
  
  sVar1 = *index;
  while (((ulong)(byte)line[sVar1] < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)line[sVar1] & 0x3f) & 1) != 0))) {
    sVar1 = sVar1 + 1;
  }
  while ((0x2c < (ulong)(byte)line[sVar1] ||
         ((0x100100002601U >> ((ulong)(byte)line[sVar1] & 0x3f) & 1) == 0))) {
    sVar1 = sVar1 + 1;
  }
  pbVar3 = (byte *)(line + sVar1);
  do {
    uVar4 = (ulong)*pbVar3;
    if (0x2c < uVar4) {
LAB_001644a0:
      *index = sVar1;
      lVar5 = 0;
      do {
        uVar2 = ParseUint64Cell(line,index);
        this->hllv[lVar5] = (uint8_t)uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      return;
    }
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0x2c) {
        sVar1 = sVar1 + 1;
      }
      goto LAB_001644a0;
    }
    sVar1 = sVar1 + 1;
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

void HyperLogLog::ParseHyperLogLog(char const* line, size_t* index)
{
    /* Skip the float value */
    size_t index_first;
    size_t index_last;
    ParseCsvCell(line, index, &index_first, &index_last);
    for (int i = 0; i < 16; i++) {
        hllv[i] = (uint8_t)ParseUint64Cell(line, index);
    }
}